

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpool.c
# Opt level: O0

void mpool_free(mpool *pool)

{
  void *pvVar1;
  long *in_RDI;
  mpool_block *p_next;
  mpool_block *p;
  undefined8 local_10;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI == 0) {
      free(in_RDI);
    }
    else {
      local_10 = (void *)*in_RDI;
      while (local_10 != (void *)0x0) {
        pvVar1 = *(void **)((long)local_10 + 0x18);
        free(*(void **)((long)local_10 + 8));
        free(local_10);
        local_10 = pvVar1;
      }
      free(in_RDI);
    }
  }
  return;
}

Assistant:

void mpool_free (struct mpool *pool)
{
    struct mpool_block *p, *p_next;

    if (!pool)
        return;

    if (!pool->block) {
        free(pool);
	       return;
    }

    p = pool->block;

    while (p) {
    	p_next = p->next;
    	free(p->bp);
    	free(p);
    	p = p_next;
    }

    free(pool);
}